

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::ReadListFile(cmake *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args,string *path)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  string *psVar3;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  bool collapse_02;
  string file;
  cmStateSnapshot snapshot;
  string homeOutputDir;
  string homeDir;
  cmMakefile mf;
  
  pcVar1 = this->GlobalGenerator;
  this_00 = pcVar1;
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    this_00 = (cmGlobalGenerator *)operator_new(0x608);
    cmGlobalGenerator::cmGlobalGenerator(this_00,this);
  }
  if (path->_M_string_length != 0) {
    cmState::Reset((cmStateSnapshot *)&mf,this->State);
    (this->CurrentSnapshot).Position.Position =
         (PositionType)
         mf.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    (this->CurrentSnapshot).State =
         (cmState *)
         mf.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map;
    (this->CurrentSnapshot).Position.Tree =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
         mf.FindPackageRootPathStack.
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Deque_impl_data._M_map_size;
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    std::__cxx11::string::string((string *)&homeDir,(string *)psVar3);
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    std::__cxx11::string::string((string *)&homeOutputDir,(string *)psVar3);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&mf,(SystemTools *)0x1,collapse);
    SetHomeDirectory(this,(string *)&mf);
    std::__cxx11::string::~string((string *)&mf);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)&mf,(SystemTools *)0x1,collapse_00);
    SetHomeOutputDirectory(this,(string *)&mf);
    std::__cxx11::string::~string((string *)&mf);
    snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
    snapshot.State = (this->CurrentSnapshot).State;
    snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&mf,&snapshot);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&file,(SystemTools *)0x1,collapse_01);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&mf,&file);
    std::__cxx11::string::~string((string *)&file);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&mf,&snapshot);
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&file,(SystemTools *)0x1,collapse_02);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)&mf,&file);
    std::__cxx11::string::~string((string *)&file);
    cmStateSnapshot::SetDefaultDefinitions(&snapshot);
    cmMakefile::cmMakefile(&mf,this_00,&snapshot);
    if (this->CurrentWorkingMode != NORMAL_MODE) {
      cmsys::SystemTools::CollapseFullPath(&file,path);
      cmsys::SystemTools::ConvertToUnixSlashes(&file);
      cmMakefile::SetScriptModeFile(&mf,&file);
      cmMakefile::SetArgcArgv(&mf,args);
      std::__cxx11::string::~string((string *)&file);
    }
    bVar2 = cmMakefile::ReadListFile(&mf,path);
    if (!bVar2) {
      std::operator+(&file,"Error processing file: ",path);
      cmSystemTools::Error(&file);
      std::__cxx11::string::~string((string *)&file);
    }
    SetHomeDirectory(this,&homeDir);
    SetHomeOutputDirectory(this,&homeOutputDir);
    cmMakefile::~cmMakefile(&mf);
    std::__cxx11::string::~string((string *)&homeOutputDir);
    std::__cxx11::string::~string((string *)&homeDir);
  }
  if (pcVar1 == (cmGlobalGenerator *)0x0) {
    (*this_00->_vptr_cmGlobalGenerator[1])(this_00);
  }
  return;
}

Assistant:

void cmake::ReadListFile(const std::vector<std::string>& args,
                         const std::string& path)
{
  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator* gg = this->GetGlobalGenerator();
  bool created = false;

  // if a generator was not specified use a generic one
  if (!gg) {
    gg = new cmGlobalGenerator(this);
    created = true;
  }

  // read in the list file to fill the cache
  if (!path.empty()) {
    this->CurrentSnapshot = this->State->Reset();
    std::string homeDir = this->GetHomeDirectory();
    std::string homeOutputDir = this->GetHomeOutputDirectory();
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    cmStateSnapshot snapshot = this->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.GetDirectory().SetCurrentSource(
      cmSystemTools::GetCurrentWorkingDirectory());
    snapshot.SetDefaultDefinitions();
    cmMakefile mf(gg, snapshot);
    if (this->GetWorkingMode() != NORMAL_MODE) {
      std::string file(cmSystemTools::CollapseFullPath(path));
      cmSystemTools::ConvertToUnixSlashes(file);
      mf.SetScriptModeFile(file);

      mf.SetArgcArgv(args);
    }
    if (!mf.ReadListFile(path)) {
      cmSystemTools::Error("Error processing file: " + path);
    }
    this->SetHomeDirectory(homeDir);
    this->SetHomeOutputDirectory(homeOutputDir);
  }

  // free generic one if generated
  if (created) {
    delete gg;
  }
}